

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::StringEnumeration::setChars
          (StringEnumeration *this,char *s,int32_t length,UErrorCode *status)

{
  UnicodeString *this_00;
  size_t sVar1;
  char16_t *us;
  
  this_00 = (UnicodeString *)0x0;
  if ((s != (char *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (length < 0) {
      sVar1 = strlen(s);
      length = (int32_t)sVar1;
    }
    this_00 = &this->unistr;
    us = UnicodeString::getBuffer(this_00,length + 1);
    if (us == (char16_t *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      this_00 = (UnicodeString *)0x0;
    }
    else {
      u_charsToUChars_63(s,us,length);
      us[length] = L'\0';
      UnicodeString::releaseBuffer(this_00,length);
    }
  }
  return this_00;
}

Assistant:

UnicodeString *
StringEnumeration::setChars(const char *s, int32_t length, UErrorCode &status) {
    if(U_SUCCESS(status) && s!=NULL) {
        if(length<0) {
            length=(int32_t)uprv_strlen(s);
        }

        UChar *buffer=unistr.getBuffer(length+1);
        if(buffer!=NULL) {
            u_charsToUChars(s, buffer, length);
            buffer[length]=0;
            unistr.releaseBuffer(length);
            return &unistr;
        } else {
            status=U_MEMORY_ALLOCATION_ERROR;
        }
    }

    return NULL;
}